

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O0

void api_suite::api_signed_output(void)

{
  undefined4 local_158 [2];
  int local_150 [2];
  int result;
  undefined1 local_140 [8];
  decoder_type decoder;
  char input [3];
  
  decoder.current.scan._261_2_ = 0x3234;
  decoder.current.scan._263_1_ = 0;
  trial::protocol::json::detail::basic_decoder<char>::basic_decoder<3ul>
            ((basic_decoder<char> *)local_140,
             (value_type (*) [3])((long)&decoder.current.scan + 0x105));
  result = trial::protocol::json::detail::basic_decoder<char>::code
                     ((basic_decoder<char> *)local_140);
  local_150[1] = 8;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::integer",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x4d,"void api_suite::api_signed_output()",&result,local_150 + 1);
  local_150[0] = 0;
  trial::protocol::json::detail::basic_decoder<char>::signed_value<int>
            ((basic_decoder<char> *)local_140,local_150);
  local_158[0] = 0x2a;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("result","42",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x50,"void api_suite::api_signed_output()",local_150,local_158);
  return;
}

Assistant:

void api_signed_output()
{
    const char input[] = "42";
    decoder_type decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::integer);
    int result = {};
    TRIAL_PROTOCOL_TEST_NO_THROW(decoder.signed_value(result));
    TRIAL_PROTOCOL_TEST_EQUAL(result, 42);
}